

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O3

Aig_Obj_t * Saig_ManRetimeNodeBwd(Aig_Man_t *p,Aig_Obj_t *pObjLo)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x81,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  uVar4 = (uint)*(undefined8 *)&pObjLo->field_0x18;
  if (0xfffffffd < (uVar4 & 7) - 7) {
    __assert_fail("!Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
  }
  iVar1 = (pObjLo->field_0).CioId;
  if (iVar1 < 1) {
    __assert_fail("Aig_ObjCioId(pObjLo) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x82,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (((uVar4 & 7) == 2) && (p->nTruePis <= iVar1)) {
    uVar4 = (iVar1 - p->nTruePis) + p->nTruePos;
    if ((-1 < (int)uVar4) && ((int)uVar4 < p->vCos->nSize)) {
      uVar2 = *(ulong *)((long)p->vCos->pArray[uVar4] + 8);
      uVar5 = uVar2 & 0xfffffffffffffffe;
      if ((*(uint *)(uVar5 + 0x18) & 7) - 7 < 0xfffffffe) {
        return (Aig_Obj_t *)0x0;
      }
      uVar3 = *(ulong *)(uVar5 + 8);
      uVar5 = *(ulong *)(uVar5 + 0x10);
      uVar4 = (uint)uVar2;
      pAVar6 = Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar3 ^ uVar4 & 1));
      (pAVar6->field_0).CioId = p->nObjs[3] + -1;
      pAVar6 = Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar4 & 1 ^ uVar5));
      (pAVar6->field_0).CioId = p->nObjs[3] + -1;
      pAVar6 = Aig_ObjCreateCi(p);
      (pAVar6->field_0).CioId = p->nObjs[2] + -1;
      pAVar7 = Aig_ObjCreateCi(p);
      (pAVar7->field_0).CioId = p->nObjs[2] + -1;
      p->nRegs = p->nRegs + 2;
      pAVar6 = Aig_And(p,(Aig_Obj_t *)((ulong)(((uint)uVar3 ^ uVar4) & 1) ^ (ulong)pAVar6),
                       (Aig_Obj_t *)((ulong)(((uint)uVar5 ^ uVar4) & 1) ^ (ulong)pAVar7));
      return pAVar6;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Saig_ObjIsLo(p, pObjLo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                ,0x83,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Saig_ManRetimeNodeBwd( Aig_Man_t * p, Aig_Obj_t * pObjLo )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pLo0New, * pLo1New;
    Aig_Obj_t * pLi0New, * pLi1New;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi;
    int fCompl0, fCompl1;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjCioId(pObjLo) > 0 );
    assert( Saig_ObjIsLo(p, pObjLo) );

    // get the corresponding latch input
    pObjLi = Saig_ManLi( p, Aig_ObjCioId(pObjLo) - Saig_ManPiNum(p) );

    // get the node
    pObj = Aig_ObjFanin0(pObjLi);
    if ( !Aig_ObjIsNode(pObj) )
        return NULL;

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);

    // get the complemented attributes of the fanins
    fCompl0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFaninC0(pObjLi);
    fCompl1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFaninC0(pObjLi);

    // create latch inputs
    pLi0New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin0, fCompl0) );
    pLi0New->CioId = Aig_ManCoNum(p) - 1;
    pLi1New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin1, fCompl1) );
    pLi1New->CioId = Aig_ManCoNum(p) - 1;

    // create latch outputs
    pLo0New = Aig_ObjCreateCi(p);
    pLo0New->CioId = Aig_ManCiNum(p) - 1;
    pLo1New = Aig_ObjCreateCi(p);
    pLo1New->CioId = Aig_ManCiNum(p) - 1;
    pLo0New = Aig_NotCond( pLo0New, fCompl0 );
    pLo1New = Aig_NotCond( pLo1New, fCompl1 );
    p->nRegs += 2;

    // create node
    pObjNew = Aig_And( p, pLo0New, pLo1New );
//    assert( pObjNew->fPhase == 0 );
    return pObjNew;
}